

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

TextureCubemap * LoadTextureCubemap(TextureCubemap *__return_storage_ptr__,Image image,int layout)

{
  undefined1 auVar1 [16];
  Image src;
  float fVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  float *pfVar7;
  int i;
  int width;
  float fVar8;
  float fVar9;
  Rectangle srcRec;
  undefined1 local_f8 [28];
  float fStack_dc;
  undefined8 local_d8;
  float afStack_d0 [2];
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  Image mipmapped;
  
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  switch(layout) {
  case 0:
    if (image.height < image.width) {
      width = image.height;
      if (image.width / 6 == image.height) goto LAB_00145cbb;
      layout = 4;
      iVar4 = 4;
      iVar3 = 3;
LAB_00145fbc:
      width = image.width / iVar4;
      if (image.width / iVar4 != image.height / iVar3) {
LAB_00145fcd:
        TraceLog(4,"IMAGE: Failed to detect cubemap image layout");
        return __return_storage_ptr__;
      }
    }
    else {
      if (image.height <= image.width) goto LAB_00145fcd;
      if (image.height / 6 != image.width) {
        layout = 3;
        iVar4 = 3;
        iVar3 = 4;
        goto LAB_00145fbc;
      }
      layout = 1;
      width = image.width;
    }
    break;
  case 1:
    layout = 1;
    width = image.height / 6;
    break;
  case 2:
    width = image.width / 6;
LAB_00145cbb:
    layout = 2;
    break;
  case 3:
    layout = 3;
    goto LAB_00145cc5;
  case 4:
    layout = 4;
LAB_00145cc5:
    width = image.width / layout;
    break;
  default:
    width = 0;
    goto LAB_00145cdf;
  }
  __return_storage_ptr__->width = width;
LAB_00145cdf:
  local_f8._16_4_ = 0;
  local_f8._20_4_ = 0;
  __return_storage_ptr__->height = width;
  local_f8._0_8_ = (void *)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  afStack_d0[0] = 0.0;
  afStack_d0[1] = 0.0;
  fVar9 = (float)width;
  for (lVar6 = 0xc; lVar6 != 0x6c; lVar6 = lVar6 + 0x10) {
    *(undefined8 *)(local_f8 + lVar6 + 0x14) = 0;
    *(float *)((long)&fStack_dc + lVar6) = fVar9;
    *(float *)((long)&local_d8 + lVar6) = fVar9;
  }
  switch(layout) {
  case 1:
    ImageCopy(image);
    goto LAB_00145f16;
  case 2:
    pfVar7 = (float *)&local_d8;
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      *pfVar7 = (float)(int)lVar6 * fVar9;
      pfVar7 = pfVar7 + 4;
    }
    break;
  case 3:
    local_c8 = CONCAT44(fVar9 * 3.0,fVar9);
    fVar8 = fVar9 + fVar9;
    local_98._0_4_ = 0.0;
    fVar2 = fVar9;
    goto LAB_00145e19;
  case 4:
    local_c8 = (ulong)(uint)fVar9 << 0x20;
    fVar8 = fVar9 * 3.0;
    fVar2 = fVar9 + fVar9;
    local_98._0_4_ = fVar9;
LAB_00145e19:
    local_a8 = CONCAT44(fVar9 + fVar9,fVar9);
    local_98 = CONCAT44(fVar9,(float)local_98);
    local_b8 = (ulong)(uint)fVar9;
    local_d8 = CONCAT44(fVar9,fVar2);
    local_88 = CONCAT44(fVar9,fVar8);
  }
  local_78 = fVar9;
  GenImageColor((Image *)local_f8,width,width * 6,(Color)0xffff00ff);
  ImageFormat((Image *)local_f8,image.format);
  ImageCopy(image);
  ImageMipmaps(&mipmapped);
  ImageMipmaps((Image *)local_f8);
  fVar9 = local_78;
  pfVar7 = afStack_d0;
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    auVar1._8_4_ = fVar9;
    auVar1._4_4_ = fVar9;
    src.width = mipmapped.width;
    src.height = mipmapped.height;
    src.data = mipmapped.data;
    src.mipmaps = mipmapped.mipmaps;
    src.format = mipmapped.format;
    srcRec.width = pfVar7[0];
    srcRec.height = pfVar7[1];
    srcRec.x = pfVar7[-2];
    srcRec.y = pfVar7[-1];
    auVar1._0_4_ = (float)(int)lVar6 * local_78;
    auVar1._12_4_ = 0;
    ImageDraw((Image *)local_f8,src,srcRec,(Rectangle)(auVar1 << 0x20),(Color)0xffffffff);
    pfVar7 = pfVar7 + 4;
  }
  free(mipmapped.data);
LAB_00145f16:
  uVar5 = rlLoadTextureCubemap((void *)local_f8._0_8_,width,local_f8._20_4_,local_f8._16_4_);
  __return_storage_ptr__->id = uVar5;
  if (uVar5 == 0) {
    TraceLog(4,"IMAGE: Failed to load cubemap image");
  }
  else {
    __return_storage_ptr__->format = local_f8._20_4_;
    __return_storage_ptr__->mipmaps = 1;
  }
  free((void *)local_f8._0_8_);
  return __return_storage_ptr__;
}

Assistant:

TextureCubemap LoadTextureCubemap(Image image, int layout)
{
    TextureCubemap cubemap = { 0 };

    if (layout == CUBEMAP_LAYOUT_AUTO_DETECT)      // Try to automatically guess layout type
    {
        // Check image width/height to determine the type of cubemap provided
        if (image.width > image.height)
        {
            if ((image.width/6) == image.height) { layout = CUBEMAP_LAYOUT_LINE_HORIZONTAL; cubemap.width = image.width/6; }
            else if ((image.width/4) == (image.height/3)) { layout = CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE; cubemap.width = image.width/4; }
        }
        else if (image.height > image.width)
        {
            if ((image.height/6) == image.width) { layout = CUBEMAP_LAYOUT_LINE_VERTICAL; cubemap.width = image.height/6; }
            else if ((image.width/3) == (image.height/4)) { layout = CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR; cubemap.width = image.width/3; }
        }
    }
    else
    {
        if (layout == CUBEMAP_LAYOUT_LINE_VERTICAL) cubemap.width = image.height/6;
        if (layout == CUBEMAP_LAYOUT_LINE_HORIZONTAL) cubemap.width = image.width/6;
        if (layout == CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR) cubemap.width = image.width/3;
        if (layout == CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE) cubemap.width = image.width/4;
    }

    cubemap.height = cubemap.width;

    // Layout provided or already auto-detected
    if (layout != CUBEMAP_LAYOUT_AUTO_DETECT)
    {
        int size = cubemap.width;

        Image faces = { 0 };                // Vertical column image
        Rectangle faceRecs[6] = { 0 };      // Face source rectangles

        for (int i = 0; i < 6; i++) faceRecs[i] = (Rectangle){ 0, 0, (float)size, (float)size };

        if (layout == CUBEMAP_LAYOUT_LINE_VERTICAL)
        {
            faces = ImageCopy(image);       // Image data already follows expected convention
        }
        /*else if (layout == CUBEMAP_LAYOUT_PANORAMA)
        {
            // TODO: implement panorama by converting image to square faces...
            // Ref: https://github.com/denivip/panorama/blob/master/panorama.cpp
        } */
        else
        {
            if (layout == CUBEMAP_LAYOUT_LINE_HORIZONTAL) for (int i = 0; i < 6; i++) faceRecs[i].x = (float)size*i;
            else if (layout == CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR)
            {
                faceRecs[0].x = (float)size; faceRecs[0].y = (float)size;
                faceRecs[1].x = (float)size; faceRecs[1].y = (float)size*3;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = 0; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*2; faceRecs[5].y = (float)size;
            }
            else if (layout == CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE)
            {
                faceRecs[0].x = (float)size*2; faceRecs[0].y = (float)size;
                faceRecs[1].x = 0; faceRecs[1].y = (float)size;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = (float)size; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*3; faceRecs[5].y = (float)size;
            }

            // Convert image data to 6 faces in a vertical column, that's the optimum layout for loading
            faces = GenImageColor(size, size*6, MAGENTA);
            ImageFormat(&faces, image.format);

            Image mipmapped = ImageCopy(image);
            ImageMipmaps(&mipmapped);
            ImageMipmaps(&faces);

            // NOTE: Image formatting does not work with compressed textures

            for (int i = 0; i < 6; i++) ImageDraw(&faces, mipmapped, faceRecs[i], (Rectangle){ 0, (float)size*i, (float)size, (float)size }, WHITE);

            UnloadImage(mipmapped);
        }

        // NOTE: Cubemap data is expected to be provided as 6 images in a single data array,
        // one after the other (that's a vertical image), following convention: +X, -X, +Y, -Y, +Z, -Z
        cubemap.id = rlLoadTextureCubemap(faces.data, size, faces.format, faces.mipmaps);

        if (cubemap.id != 0)
        {
            cubemap.format = faces.format;
            cubemap.mipmaps = 1;
        }
        else TRACELOG(LOG_WARNING, "IMAGE: Failed to load cubemap image");

        UnloadImage(faces);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Failed to detect cubemap image layout");

    return cubemap;
}